

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

xmlMutexPtr xmlNewMutex(void)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)malloc(0x28);
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)0x0;
  }
  else {
    pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  }
  return (xmlMutexPtr)__mutex;
}

Assistant:

xmlMutexPtr
xmlNewMutex(void)
{
    xmlMutexPtr tok;

    tok = malloc(sizeof(xmlMutex));
    if (tok == NULL)
        return (NULL);
    xmlInitMutex(tok);
    return (tok);
}